

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O1

void __thiscall
cppcms::url_dispatcher::assign<disp>
          (url_dispatcher *this,string *regex,member_type member,disp *object,int e1,int e2,int e3)

{
  undefined4 in_register_00000084;
  undefined4 in_stack_00000010;
  member_type *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58 = (member_type *)0x0;
  uStack_50 = 0;
  local_58 = (member_type *)operator_new(0x18);
  *local_58 = member;
  local_58[1] = (member_type)object;
  local_58[2] = CONCAT44(in_register_00000084,e1);
  pcStack_40 = std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_cppcms::url_dispatcher::binder3<disp>_>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_cppcms::url_dispatcher::binder3<disp>_>
             ::_M_manager;
  cppcms::url_dispatcher::assign(this,regex,&local_58,e2,e3,in_stack_00000010);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(std::string,std::string,std::string),C *object,int e1,int e2,int e3)
		{
			assign(regex,binder3<C>(member,object),e1,e2,e3);
		}